

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssertPropertyStmt *stmt)

{
  Sequence *this_00;
  char cVar1;
  bool bVar2;
  PropertyAction PVar3;
  Property *this_01;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  string *psVar6;
  EventControl *pEVar7;
  remove_reference_t<std::__cxx11::basic_string<char>_> *prVar8;
  __shared_ptr *this_02;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *this_03;
  element_type *peVar9;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*format_str) [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view __str;
  format_args args_00;
  string_view format_str_00;
  string local_1d8 [4];
  PropertyAction action_type;
  string action;
  anon_class_8_1_8991fb9c local_1a8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
  local_1a0;
  string local_180;
  anon_class_8_1_8991fb9c local_150;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  local_148;
  string local_128;
  string local_108;
  string_view local_e8;
  Sequence *local_d8;
  Sequence *seq;
  EventControl edge;
  Property *property;
  AssertPropertyStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  this_01 = AssertPropertyStmt::property(stmt);
  join_0x00000010_0x00000000_ = indent(this);
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,
                           join_0x00000010_0x00000000_);
  poVar5 = std::operator<<(pbVar4,"property ");
  psVar6 = Property::property_name_abi_cxx11_(this_01);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  poVar5 = std::operator<<(poVar5,";");
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar5,cVar1);
  increase_indent(this);
  pEVar7 = Property::edge(this_01);
  seq = (Sequence *)pEVar7->delay;
  edge.delay = (uint64_t)pEVar7->var;
  edge.var = *(Var **)&pEVar7->type;
  edge.type = pEVar7->delay_side;
  edge.edge = *(EventEdgeType *)&pEVar7->field_0x1c;
  local_d8 = Property::sequence(this_01);
  if (edge.delay != 0) {
    local_e8 = indent(this);
    prVar8 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
             std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,local_e8);
    args = prVar8;
    local_150.this = this;
    std::function<std::__cxx11::string(kratos::Var_const*)>::
    function<kratos::SystemVerilogCodeGen::stmt_code(kratos::AssertPropertyStmt*)::__0,void>
              ((function<std::__cxx11::string(kratos::Var_const*)> *)&local_148,&local_150);
    EventControl::to_string(&local_128,(EventControl *)&seq,&local_148);
    local_38 = &local_108;
    local_40 = "@({0}) ";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128;
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[8],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"@({0}) ",(v7 *)vargs,format_str,args);
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    format_str_00.size_ = (size_t)this_local;
    format_str_00.data_ = (char *)local_78.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_108,(detail *)local_78.data_,format_str_00,args_00);
    std::operator<<((ostream *)prVar8,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
    ::~function(&local_148);
  }
  this_00 = local_d8;
  local_1a8.this = this;
  std::function<std::__cxx11::string(kratos::Var*)>::
  function<kratos::SystemVerilogCodeGen::stmt_code(kratos::AssertPropertyStmt*)::__1,void>
            ((function<std::__cxx11::string(kratos::Var*)> *)&local_1a0,&local_1a8);
  Sequence::to_string(&local_180,this_00,&local_1a0);
  poVar5 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                           (string *)&local_180);
  poVar5 = std::operator<<(poVar5,";");
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar5,cVar1);
  std::__cxx11::string::~string((string *)&local_180);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
  ::~function(&local_1a0);
  decrease_indent(this);
  join_0x00000010_0x00000000_ = indent(this);
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,
                           join_0x00000010_0x00000000_);
  poVar5 = std::operator<<(pbVar4,"endproperty");
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar5,cVar1);
  std::__cxx11::string::string(local_1d8);
  PVar3 = Property::action(this_01);
  if (PVar3 == Assert) {
    std::__cxx11::string::operator=(local_1d8,"assert");
  }
  else if (PVar3 == Assume) {
    std::__cxx11::string::operator=(local_1d8,"assume");
  }
  else {
    if (PVar3 != Cover) goto LAB_00404a67;
    std::__cxx11::string::operator=(local_1d8,"cover");
  }
  __str = indent(this);
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,__str);
  poVar5 = std::operator<<(pbVar4,local_1d8);
  poVar5 = std::operator<<(poVar5," property (");
  psVar6 = Property::property_name_abi_cxx11_(this_01);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::operator<<(poVar5,")");
  this_02 = (__shared_ptr *)AssertPropertyStmt::else_(stmt);
  bVar2 = std::__shared_ptr::operator_cast_to_bool(this_02);
  if ((bVar2) && (PVar3 == Assert)) {
    this_03 = &AssertPropertyStmt::else_(stmt)->
               super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
    peVar9 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(this_03);
    (**this->_vptr_SystemVerilogCodeGen)(this,peVar9);
  }
  else {
    poVar5 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,';');
    cVar1 = Stream::endl(&this->stream_);
    std::operator<<(poVar5,cVar1);
  }
LAB_00404a67:
  std::__cxx11::string::~string(local_1d8);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssertPropertyStmt* stmt) {
    auto* property = stmt->property();
    stream_ << indent() << "property " << property->property_name() << ";" << stream_.endl();
    increase_indent();
    auto edge = property->edge();
    auto* seq = property->sequence();
    if (edge.var) {
        stream_ << indent() << ::format("@({0}) ", edge.to_string([this](const Var* var) {
            return stream_.var_str(var);
        }));
    }
    stream_ << seq->to_string([this](Var* v) { return stream_.var_str(v); }) << ";"
            << stream_.endl();
    decrease_indent();
    stream_ << indent() << "endproperty" << stream_.endl();

    // put assert here
    std::string action;
    auto const action_type = property->action();
    if (action_type == PropertyAction::Assert)
        action = "assert";
    else if (action_type == PropertyAction::Assume)
        action = "assume";
    else if (action_type == PropertyAction::Cover)
        action = "cover";
    else
        return;
    stream_ << indent() << action << " property (" << property->property_name() << ")";
    if (stmt->else_() && action_type == PropertyAction::Assert) {
        dispatch_node(stmt->else_().get());
    } else {
        stream_ << ';' << stream_.endl();
    }
}